

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O3

int KINSetJacTimesVecFn(void *kinmem,KINLsJacTimesVecFn jtv)

{
  int iVar1;
  KINMem kin_mem;
  KINLsMem kinls_mem;
  KINMem local_20;
  KINLsMem local_18;
  
  iVar1 = kinLs_AccessLMem(kinmem,"KINSetJacTimesVecFn",&local_20,&local_18);
  if (iVar1 == 0) {
    if (local_18->LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0
       ) {
      iVar1 = -3;
      KINProcessError(local_20,-3,0x148,"KINSetJacTimesVecFn",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                      ,"SUNLinearSolver object does not support user-supplied ATimes routine");
    }
    else {
      if (jtv == (KINLsJacTimesVecFn)0x0) {
        local_18->jtimesDQ = 1;
        local_18->jtimes = kinLsDQJtimes;
        local_18->jt_func = local_20->kin_func;
      }
      else {
        local_18->jtimesDQ = 0;
        local_18->jtimes = jtv;
        local_20 = (KINMem)local_20->kin_user_data;
      }
      local_18->jt_data = local_20;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int KINSetJacTimesVecFn(void* kinmem, KINLsJacTimesVecFn jtv)
{
  int retval;
  KINMem kin_mem;
  KINLsMem kinls_mem;

  /* access KINLsMem structure */
  retval = kinLs_AccessLMem(kinmem, __func__, &kin_mem, &kinls_mem);
  if (retval != KIN_SUCCESS) { return (retval); }

  /* issue error if LS object does not support user-supplied ATimes */
  if (kinls_mem->LS->ops->setatimes == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "SUNLinearSolver object does not support user-supplied "
                    "ATimes routine");
    return (KINLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routine in KINLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtv != NULL)
  {
    kinls_mem->jtimesDQ = SUNFALSE;
    kinls_mem->jtimes   = jtv;
    kinls_mem->jt_data  = kin_mem->kin_user_data;
  }
  else
  {
    kinls_mem->jtimesDQ = SUNTRUE;
    kinls_mem->jtimes   = kinLsDQJtimes;
    kinls_mem->jt_func  = kin_mem->kin_func;
    kinls_mem->jt_data  = kin_mem;
  }

  return (KINLS_SUCCESS);
}